

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O2

double ising::square::transfer_matrix::free_energy(double beta,int Lx,int Ly,double J,double H)

{
  size_type __n;
  int iVar1;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  allocator_type local_71;
  double local_70;
  double local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  double local_30;
  double local_28;
  
  iVar1 = Ly * Lx;
  local_70 = H;
  local_68 = beta;
  local_30 = H;
  local_28 = J;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)(iVar1 * 2),&local_28,
             (allocator_type *)&local_60);
  __n = 0;
  if (local_70 != 0.0) {
    __n = (long)iVar1;
  }
  if (NAN(local_70)) {
    __n = (long)iVar1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,__n,&local_30,&local_71);
  local_70 = free_energy(local_68,Lx,Ly,(vector<double,_std::allocator<double>_> *)&local_48,
                         (vector<double,_std::allocator<double>_> *)&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return local_70;
}

Assistant:

static double free_energy(double beta, int Lx, int Ly, double J, double H = 0.0) {
    std::vector<double> inter(2 * Lx * Ly, J);
    std::vector<double> field((H != 0.0) ? (Lx * Ly) : 0, H);
    return free_energy(beta, Lx, Ly, inter, field);
  }